

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderAtomicCountersTests.cpp
# Opt level: O2

long __thiscall gl4cts::BasicBufferOperations::Run(BasicBufferOperations *this)

{
  CallLogWrapper *this_00;
  GLuint *buffers;
  void *pvVar1;
  GLuint i_2;
  long lVar2;
  GLuint i_1;
  ulong uVar3;
  GLuint i;
  long lVar4;
  GLuint *data_00;
  ulong uVar5;
  GLuint data [8];
  
  this_00 = &(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  buffers = &this->buffer_;
  glu::CallLogWrapper::glGenBuffers(this_00,1,buffers);
  glu::CallLogWrapper::glBindBuffer(this_00,0x92c0,this->buffer_);
  glu::CallLogWrapper::glBufferData(this_00,0x92c0,0x20,(void *)0x0,0x88e4);
  glu::CallLogWrapper::glBindBuffer(this_00,0x92c0,0);
  glu::CallLogWrapper::glBindBuffer(this_00,0x92c0,this->buffer_);
  pvVar1 = glu::CallLogWrapper::glMapBuffer(this_00,0x92c0,0x88b9);
  for (lVar4 = 0; lVar4 != 8; lVar4 = lVar4 + 1) {
    *(int *)((long)pvVar1 + lVar4 * 4) = (int)lVar4;
  }
  glu::CallLogWrapper::glUnmapBuffer(this_00,0x92c0);
  glu::CallLogWrapper::glBindBuffer(this_00,0x92c0,0);
  glu::CallLogWrapper::glBindBuffer(this_00,0x92c0,*buffers);
  data_00 = data;
  glu::CallLogWrapper::glGetBufferSubData(this_00,0x92c0,0,0x20,data_00);
  glu::CallLogWrapper::glBindBuffer(this_00,0x92c0,0);
  lVar4 = 0;
  for (uVar3 = 0; uVar3 != 8; uVar3 = uVar3 + 1) {
    if (uVar3 != data[uVar3]) {
      gl4cts::anon_unknown_0::Output
                ("data[%u] is: %u should be: %u\n",uVar3 & 0xffffffff,(ulong)data[uVar3],
                 uVar3 & 0xffffffff);
      lVar4 = -1;
    }
  }
  if (lVar4 == 0) {
    glu::CallLogWrapper::glBindBuffer(this_00,0x92c0,*buffers);
    pvVar1 = glu::CallLogWrapper::glMapBufferRange(this_00,0x92c0,0,0x20,2);
    for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 2) {
      *(int *)((long)pvVar1 + lVar4 * 2) = (int)lVar4;
    }
    glu::CallLogWrapper::glUnmapBuffer(this_00,0x92c0);
    glu::CallLogWrapper::glBindBuffer(this_00,0x92c0,0);
    glu::CallLogWrapper::glBindBuffer(this_00,0x92c0,*buffers);
    pvVar1 = glu::CallLogWrapper::glMapBufferRange(this_00,0x92c0,0,0x20,1);
    uVar5 = 0;
    lVar4 = 0;
    for (uVar3 = 0; uVar3 != 0x10; uVar3 = uVar3 + 2) {
      if (uVar3 != *(uint *)((long)pvVar1 + uVar3 * 2)) {
        gl4cts::anon_unknown_0::Output
                  ("data[%u] is: %u should be: %u\n",uVar5,(ulong)*(uint *)((long)data + uVar3 * 2),
                   uVar3 & 0xffffffff);
        lVar4 = -1;
      }
      uVar5 = (ulong)((int)uVar5 + 1);
    }
    glu::CallLogWrapper::glUnmapBuffer(this_00,0x92c0);
    glu::CallLogWrapper::glBindBuffer(this_00,0x92c0,0);
    glu::CallLogWrapper::glBindBuffer(this_00,0x92c0,*buffers);
    for (lVar2 = 0; lVar2 != 0x18; lVar2 = lVar2 + 3) {
      *data_00 = (GLuint)lVar2;
      data_00 = data_00 + 1;
    }
    glu::CallLogWrapper::glBufferSubData(this_00,0x92c0,0,0x20,data);
    for (lVar2 = 0; lVar2 != 8; lVar2 = lVar2 + 1) {
      data[lVar2] = 0;
    }
    glu::CallLogWrapper::glGetBufferSubData(this_00,0x92c0,0,0x20,data);
    glu::CallLogWrapper::glBindBuffer(this_00,0x92c0,0);
    uVar5 = 0;
    for (uVar3 = 0; uVar3 != 0x18; uVar3 = uVar3 + 3) {
      if (uVar3 != data[uVar5]) {
        gl4cts::anon_unknown_0::Output
                  ("data[%u] is: %u should be: %u\n",uVar5 & 0xffffffff,(ulong)data[uVar5],
                   uVar3 & 0xffffffff);
        lVar4 = -1;
      }
      uVar5 = uVar5 + 1;
    }
  }
  else {
    lVar4 = -1;
  }
  return lVar4;
}

Assistant:

virtual long Run()
	{
		glGenBuffers(1, &buffer_);
		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, buffer_);
		glBufferData(GL_ATOMIC_COUNTER_BUFFER, 8 * 4, NULL, GL_STATIC_DRAW);
		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, 0);

		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, buffer_);
		GLuint* ptr = static_cast<GLuint*>(glMapBuffer(GL_ATOMIC_COUNTER_BUFFER, GL_WRITE_ONLY));
		for (GLuint i = 0; i < 8; ++i)
			ptr[i]	= i;
		glUnmapBuffer(GL_ATOMIC_COUNTER_BUFFER);
		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, 0);

		long   res = NO_ERROR;
		GLuint data[8];
		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, buffer_);
		glGetBufferSubData(GL_ATOMIC_COUNTER_BUFFER, 0, sizeof(data), data);
		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, 0);
		for (GLuint i = 0; i < 8; ++i)
		{
			if (data[i] != i)
			{
				Output("data[%u] is: %u should be: %u\n", i, data[i], i);
				res = ERROR;
			}
		}
		if (res != NO_ERROR)
			return res;

		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, buffer_);
		ptr = static_cast<GLuint*>(glMapBufferRange(GL_ATOMIC_COUNTER_BUFFER, 0, 32, GL_MAP_WRITE_BIT));
		for (GLuint i = 0; i < 8; ++i)
			ptr[i]	= i * 2;
		glUnmapBuffer(GL_ATOMIC_COUNTER_BUFFER);
		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, 0);

		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, buffer_);
		ptr = static_cast<GLuint*>(glMapBufferRange(GL_ATOMIC_COUNTER_BUFFER, 0, 32, GL_MAP_READ_BIT));
		for (GLuint i = 0; i < 8; ++i)
		{
			if (ptr[i] != i * 2)
			{
				Output("data[%u] is: %u should be: %u\n", i, data[i], i * 2);
				res = ERROR;
			}
		}
		glUnmapBuffer(GL_ATOMIC_COUNTER_BUFFER);
		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, 0);

		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, buffer_);
		for (GLuint i = 0; i < 8; ++i)
			data[i]   = i * 3;
		glBufferSubData(GL_ATOMIC_COUNTER_BUFFER, 0, 32, data);
		for (GLuint i = 0; i < 8; ++i)
			data[i]   = 0;
		glGetBufferSubData(GL_ATOMIC_COUNTER_BUFFER, 0, sizeof(data), data);
		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, 0);
		for (GLuint i = 0; i < 8; ++i)
		{
			if (data[i] != i * 3)
			{
				Output("data[%u] is: %u should be: %u\n", i, data[i], i * 3);
				res = ERROR;
			}
		}

		return res;
	}